

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall
ktx::FatalValidationError::FatalValidationError(FatalValidationError *this,ValidationReport *report)

{
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&report->details);
  *(undefined ***)this = &PTR__FatalValidationError_002429f8;
  ValidationReport::ValidationReport(&this->report,report);
  return;
}

Assistant:

explicit FatalValidationError(ValidationReport report) :
        std::runtime_error(report.details),
        report(std::move(report)) {}